

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_proxy.cpp
# Opt level: O2

void __thiscall TcpProxy::start(TcpProxy *this)

{
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/tcp_proxy.cpp:18:32)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/tcp_proxy.cpp:18:32)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  std::function<void_(Liby::Connection_&)>::operator=
            (&((this->proxyServer_).super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->acceptorCallback_,(function<void_(Liby::Connection_&)> *)&local_30);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/tcp_proxy.cpp:20:13)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/tcp_proxy.cpp:20:13)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  std::function<void_(Liby::Connection_&)>::operator=
            (&((this->proxyServer_).super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->readEventCallback_,(function<void_(Liby::Connection_&)> *)&local_30);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/tcp_proxy.cpp:21:30)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/tcp_proxy.cpp:21:30)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  std::function<void_(Liby::Connection_&)>::operator=
            (&((this->proxyServer_).super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->erroEventCallback_,(function<void_(Liby::Connection_&)> *)&local_30);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  return;
}

Assistant:

void start() {
        proxyServer_->onAccept([this](Connection &conn) { onAccept(conn); });
        proxyServer_->onRead(
            [this](Connection &conn) { handleConnectRequest(conn); });
        proxyServer_->onErro([this](Connection &conn) { onErro(conn); });
    }